

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

__pid_t __thiscall acto::core::event::wait(event *this,void *__stat_loc)

{
  undefined1 local_20 [8];
  unique_lock<std::mutex> g;
  event *this_local;
  
  g._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->mutex_);
  std::condition_variable::wait<acto::core::event::wait()::__0>
            (&this->cond_,(unique_lock<std::mutex> *)local_20,(anon_class_8_1_8991fb9c)this);
  this->triggered_ = (bool)((this->auto_ ^ 0xffU) & 1);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return 1;
}

Assistant:

wait_result event::wait() {
  std::unique_lock g(mutex_);

  cond_.wait(g, [this] { return triggered_; });

  triggered_ = !auto_;

  return wait_result::signaled;
}